

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall
CCharmapToUniMB::set_mapping(CCharmapToUniMB *this,wchar_t uni_code_pt,wchar_t local_code_pt)

{
  undefined8 *puVar1;
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  wchar_t *p;
  size_t i;
  wchar_t *subp;
  cmap_mb_entry *entp;
  undefined4 *local_30;
  long local_28;
  undefined4 *local_20;
  
  if ((int)in_EDX < 0x100) {
    *(undefined4 *)(in_RDI + (ulong)(in_EDX & 0xff) * 0x10 + 0x18) = in_ESI;
  }
  else {
    puVar1 = (undefined8 *)(in_RDI + 0x10 + (ulong)((int)in_EDX >> 8 & 0xff) * 0x10);
    local_20 = (undefined4 *)*puVar1;
    if (local_20 == (undefined4 *)0x0) {
      local_20 = (undefined4 *)malloc(0x400);
      *puVar1 = local_20;
      local_28 = 0x100;
      local_30 = local_20;
      while (local_28 != 0) {
        local_28 = local_28 + -1;
        *local_30 = 0xfffd;
        local_30 = local_30 + 1;
      }
    }
    local_20[in_EDX & 0xff] = in_ESI;
  }
  return;
}

Assistant:

void CCharmapToUniMB::set_mapping(wchar_t uni_code_pt, wchar_t local_code_pt)
{
    /* 
     *   Check to see if it's a one-byte or two-byte mapping.  If the local
     *   code point is in the range 0-255, it's a one-byte character;
     *   otherwise, it's a two-byte character.  
     */
    if (local_code_pt <= 255)
    {
        /* it's a single-byte character, so simply set the mapping */
        map_[(unsigned char)local_code_pt].ch = uni_code_pt;
    }
    else
    {
        cmap_mb_entry *entp;
        wchar_t *subp;

        /* 
         *   Get the mapping table entry for the lead byte.  The lead byte of
         *   the local code point is given by the high-order byte of the
         *   local code point.  (Note that this doesn't have anything to do
         *   with the endian-ness of the local platform.  The generic Unicode
         *   mapping tables are specifically designed this way, independently
         *   of endian-ness.)  
         */
        entp = &map_[(unsigned char)((local_code_pt >> 8) & 0xff)];

        /* 
         *   It's a two-byte character.  The high-order byte is the lead
         *   byte, and the low-order byte is the trailing byte of the
         *   two-byte sequence.  
         *   
         *   If we haven't previously set up a sub-table for the lead byte,
         *   do so now.  
         */
        if ((subp = entp->sub) == 0)
        {
            size_t i;
            wchar_t *p;

            /* allocate a new sub-mapping table for the lead byte */
            subp = entp->sub = (wchar_t *)t3malloc(256 * sizeof(wchar_t));

            /* initialize each entry to U+FFFD, in case we never map them */
            for (i = 256, p = subp ; i != 0 ; --i, *p++ = 0xFFFD) ;
        }

        /* set the mapping in the sub-table for the second byte */
        subp[(unsigned char)(local_code_pt & 0xff)] = uni_code_pt;
    }
}